

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O3

bool google::protobuf::compiler::js::anon_unknown_0::HasExtensions(Descriptor *desc)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  iVar2 = *(int *)(desc + 0x78);
  if (0 < iVar2) {
    lVar4 = 0x58;
    lVar3 = 0;
    do {
      if (*(char *)(*(long *)(desc + 0x80) + -8 + lVar4) == '\x01') {
        iVar2 = std::__cxx11::string::compare
                          ((char *)**(undefined8 **)
                                     (*(long *)(*(long *)(desc + 0x80) + lVar4) + 0x10));
        if (iVar2 != 0) {
          return true;
        }
        iVar2 = *(int *)(desc + 0x78);
      }
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 0xa8;
    } while (lVar3 < iVar2);
  }
  if (*(int *)(desc + 0x48) < 1) {
    bVar1 = false;
  }
  else {
    lVar3 = 0;
    lVar4 = 0;
    do {
      bVar1 = HasExtensions((Descriptor *)(*(long *)(desc + 0x50) + lVar3));
      if (bVar1) {
        return bVar1;
      }
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0xa8;
    } while (lVar4 < *(int *)(desc + 0x48));
  }
  return bVar1;
}

Assistant:

bool HasExtensions(const Descriptor* desc) {
  for (int i = 0; i < desc->extension_count(); i++) {
    if (ShouldGenerateExtension(desc->extension(i))) {
      return true;
    }
  }
  for (int i = 0; i < desc->nested_type_count(); i++) {
    if (HasExtensions(desc->nested_type(i))) {
      return true;
    }
  }
  return false;
}